

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O1

void secp256k1_scratch_destroy(secp256k1_callback *error_callback,secp256k1_scratch *scratch)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  bool bVar87;
  bool bVar88;
  int iVar89;
  long lVar90;
  ulong uVar91;
  ulong uVar92;
  secp256k1_ge *extraout_RDX;
  ulong uVar93;
  secp256k1_ge *a;
  uint uVar94;
  secp256k1_ge *a_00;
  ulong uVar95;
  int iVar96;
  bool bVar97;
  secp256k1_gej sStack_248;
  secp256k1_ge *psStack_1b0;
  ulong uStack_1a8;
  ulong uStack_1a0;
  secp256k1_scratch *psStack_198;
  ulong uStack_188;
  ulong uStack_180;
  ulong uStack_178;
  secp256k1_ge_storage sStack_170;
  undefined1 auStack_130 [56];
  uint64_t uStack_f8;
  uint64_t uStack_f0;
  uint64_t uStack_e8;
  uint64_t uStack_e0;
  undefined8 uStack_d8;
  secp256k1_ge sStack_d0;
  secp256k1_fe sStack_68;
  
  if (scratch == (secp256k1_scratch *)0x0) {
    return;
  }
  lVar90 = 0;
  do {
    uVar92 = (ulong)((uint)scratch->magic[lVar90] - (uint)(byte)"scratch"[lVar90]);
    if (scratch->magic[lVar90] != "scratch"[lVar90]) goto LAB_00107f96;
    lVar90 = lVar90 + 1;
  } while (lVar90 != 8);
  uVar92 = 0;
LAB_00107f96:
  if ((int)uVar92 != 0) {
    (*error_callback->fn)("invalid scratch space",error_callback->data);
    return;
  }
  if (scratch->alloc_size == 0) {
    scratch->magic[0] = '\0';
    scratch->magic[1] = '\0';
    scratch->magic[2] = '\0';
    scratch->magic[3] = '\0';
    scratch->magic[4] = '\0';
    scratch->magic[5] = '\0';
    scratch->magic[6] = '\0';
    scratch->magic[7] = '\0';
    free(scratch);
    return;
  }
  secp256k1_scratch_destroy_cold_1();
  if (error_callback == (secp256k1_callback *)0x0) {
    psStack_198 = (secp256k1_scratch *)0x10881b;
    secp256k1_ec_pubkey_parse_cold_6();
LAB_0010881b:
    psStack_198 = (secp256k1_scratch *)0x108820;
    secp256k1_ec_pubkey_parse_cold_5();
    return;
  }
  if (scratch == (secp256k1_scratch *)0x0) goto LAB_0010881b;
  scratch[1].alloc_size = 0;
  scratch[1].max_size = 0;
  scratch[1].magic[0] = '\0';
  scratch[1].magic[1] = '\0';
  scratch[1].magic[2] = '\0';
  scratch[1].magic[3] = '\0';
  scratch[1].magic[4] = '\0';
  scratch[1].magic[5] = '\0';
  scratch[1].magic[6] = '\0';
  scratch[1].magic[7] = '\0';
  scratch[1].data = (void *)0x0;
  scratch->alloc_size = 0;
  scratch->max_size = 0;
  scratch->magic[0] = '\0';
  scratch->magic[1] = '\0';
  scratch->magic[2] = '\0';
  scratch->magic[3] = '\0';
  scratch->magic[4] = '\0';
  scratch->magic[5] = '\0';
  scratch->magic[6] = '\0';
  scratch->magic[7] = '\0';
  scratch->data = (void *)0x0;
  if (extraout_RDX == (secp256k1_ge *)0x0) {
    psStack_198 = (secp256k1_scratch *)0x108827;
    secp256k1_ec_pubkey_parse_cold_4();
    return;
  }
  iVar96 = 0;
  iVar89 = iVar96;
  if (uVar92 != 0x41) {
    iVar89 = 0;
    if ((uVar92 == 0x21) && (iVar89 = iVar96, ((extraout_RDX->x).n[0] & 0xfe) == 2)) {
      psStack_198 = (secp256k1_scratch *)0x10803c;
      secp256k1_fe_impl_set_b32_mod
                ((secp256k1_fe *)&sStack_170,(uchar *)((long)(extraout_RDX->x).n + 1));
      bVar87 = (sStack_170.x.n[2] & sStack_170.x.n[3] & sStack_170.x.n[1]) != 0xfffffffffffff;
      bVar88 = sStack_170.y.n[0] != 0xffffffffffff;
      bVar97 = sStack_170.x.n[0] < 0xffffefffffc2f;
      if (bVar97 || (bVar87 || bVar88)) {
        sStack_170.y.n[1] = 0x100000001;
        psStack_198 = (secp256k1_scratch *)0x1081aa;
        secp256k1_fe_verify((secp256k1_fe *)&sStack_170);
      }
      else {
        sStack_170.y.n[1] = CONCAT44(sStack_170.y.n[1]._4_4_,0xffffffff);
      }
      iVar89 = 0;
      if (bVar97 || (bVar87 || bVar88)) {
        psStack_198 = (secp256k1_scratch *)0x1081d0;
        iVar89 = secp256k1_ge_set_xo_var
                           ((secp256k1_ge *)(auStack_130 + 0x30),(secp256k1_fe *)&sStack_170,
                            (uint)((char)(extraout_RDX->x).n[0] == '\x03'));
      }
    }
    goto LAB_00108756;
  }
  uVar94 = (uint)(byte)(extraout_RDX->x).n[0];
  if ((7 < uVar94) || ((0xd0U >> (uVar94 & 0x1f) & 1) == 0)) goto LAB_00108756;
  psStack_198 = (secp256k1_scratch *)0x1080e6;
  secp256k1_fe_impl_set_b32_mod
            ((secp256k1_fe *)(sStack_d0.y.n + 1),(uchar *)((long)(extraout_RDX->x).n + 1));
  bVar97 = (sStack_d0.y.n[3] & sStack_d0.y.n[4] & sStack_d0.y.n[2]) != 0xfffffffffffff;
  if (sStack_d0.y.n[1] < 0xffffefffffc2f || (bVar97 || sStack_d0.y._40_8_ != 0xffffffffffff)) {
    sStack_d0.infinity = 1;
    sStack_d0._100_4_ = 1;
    psStack_198 = (secp256k1_scratch *)0x108136;
    secp256k1_fe_verify((secp256k1_fe *)(sStack_d0.y.n + 1));
  }
  else {
    sStack_d0.infinity = -1;
  }
  iVar89 = 0;
  if (sStack_d0.y.n[1] >= 0xffffefffffc2f && (!bVar97 && sStack_d0.y._40_8_ == 0xffffffffffff))
  goto LAB_00108756;
  psStack_198 = (secp256k1_scratch *)0x108153;
  secp256k1_fe_impl_set_b32_mod
            ((secp256k1_fe *)auStack_130,(uchar *)((long)(extraout_RDX->x).n + 0x21));
  if (0xffffefffffc2e < (ulong)auStack_130._0_8_ &&
      ((auStack_130._16_8_ & auStack_130._24_8_ & auStack_130._8_8_) == 0xfffffffffffff &&
      auStack_130._32_8_ == 0xffffffffffff)) {
    auStack_130._40_4_ = -1;
    goto LAB_00108756;
  }
  auStack_130._40_4_ = 1;
  auStack_130._44_4_ = 1;
  psStack_198 = (secp256k1_scratch *)0x1081ed;
  secp256k1_fe_verify((secp256k1_fe *)auStack_130);
  psStack_198 = (secp256k1_scratch *)0x108210;
  secp256k1_ge_set_xy((secp256k1_ge *)(auStack_130 + 0x30),(secp256k1_fe *)(sStack_d0.y.n + 1),
                      (secp256k1_fe *)auStack_130);
  uVar92 = auStack_130._0_8_;
  if (((extraout_RDX->x).n[0] & 0xfe) == 6) {
    a_00 = (secp256k1_ge *)auStack_130;
    psStack_198 = (secp256k1_scratch *)0x108225;
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    if (auStack_130._44_4_ != 0) {
      uVar92 = auStack_130._0_8_ & 0xffffffffffffff01;
      if (((char)(extraout_RDX->x).n[0] != '\a') == SUB81(uVar92,0)) goto LAB_00108756;
      goto LAB_00108244;
    }
    psStack_198 = (secp256k1_scratch *)0x108830;
    secp256k1_ec_pubkey_parse_cold_3();
    a = extraout_RDX;
  }
  else {
LAB_00108244:
    psStack_198 = (secp256k1_scratch *)0x108254;
    secp256k1_ge_verify((secp256k1_ge *)(auStack_130 + 0x30));
    iVar89 = 0;
    if ((int)sStack_d0.y.n[0] != 0) {
LAB_00108756:
      if (iVar89 == 0) {
        return;
      }
      psStack_198 = (secp256k1_scratch *)0x10876e;
      iVar89 = secp256k1_ge_is_in_correct_subgroup((secp256k1_ge *)(auStack_130 + 0x30));
      if (iVar89 == 0) {
        return;
      }
      psStack_198 = (secp256k1_scratch *)0x10878e;
      secp256k1_ge_to_storage(&sStack_170,(secp256k1_ge *)(auStack_130 + 0x30));
      scratch[1].alloc_size = sStack_170.y.n[2];
      scratch[1].max_size = sStack_170.y.n[3];
      *(uint64_t *)scratch[1].magic = sStack_170.y.n[0];
      scratch[1].data = (void *)sStack_170.y.n[1];
      scratch->alloc_size = sStack_170.x.n[2];
      scratch->max_size = sStack_170.x.n[3];
      *(uint64_t *)scratch->magic = sStack_170.x.n[0];
      scratch->data = (void *)sStack_170.x.n[1];
      sStack_d0.y.n[0]._0_4_ = 0;
      uStack_d8._0_4_ = 0;
      uStack_d8._4_4_ = 1;
      auStack_130._48_8_ = 0;
      uStack_f8 = 0;
      uStack_f0 = 0;
      uStack_e8 = 0;
      uStack_e0 = 0;
      psStack_198 = (secp256k1_scratch *)0x1087de;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_130 + 0x30));
      sStack_d0.x.magnitude = 0;
      sStack_d0.x.normalized = 1;
      sStack_d0.x.n[0] = 0;
      sStack_d0.x.n[1] = 0;
      sStack_d0.x.n[2] = 0;
      sStack_d0.x.n[3] = 0;
      sStack_d0.x.n[4] = 0;
      psStack_198 = (secp256k1_scratch *)0x1087fd;
      secp256k1_fe_verify(&sStack_d0.x);
      return;
    }
    a = &sStack_d0;
    psStack_198 = (secp256k1_scratch *)0x108271;
    a_00 = a;
    secp256k1_fe_verify(&a->x);
    if (sStack_d0.x.magnitude < 9) {
      uVar92 = 0xfffffffffffff;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sStack_d0.x.n[0] * 2;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = sStack_d0.x.n[3];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = sStack_d0.x.n[1] * 2;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = sStack_d0.x.n[2];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = sStack_d0.x.n[4];
      auVar43._8_8_ = 0;
      auVar43._0_8_ = sStack_d0.x.n[4];
      uVar91 = SUB168(auVar3 * auVar43,0);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar91 & 0xfffffffffffff;
      auVar1 = auVar2 * auVar42 + auVar1 * auVar41 + auVar4 * ZEXT816(0x1000003d10);
      uVar93 = auVar1._0_8_;
      sStack_68.n[0] = uVar93 & 0xfffffffffffff;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = uVar93 >> 0x34 | auVar1._8_8_ << 0xc;
      uVar93 = sStack_d0.x.n[4] * 2;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = sStack_d0.x.n[0];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar93;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = sStack_d0.x.n[1] * 2;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = sStack_d0.x.n[3];
      auVar7._8_8_ = 0;
      auVar7._0_8_ = sStack_d0.x.n[2];
      auVar46._8_8_ = 0;
      auVar46._0_8_ = sStack_d0.x.n[2];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar91 >> 0x34 | SUB168(auVar3 * auVar43,8) << 0xc;
      auVar1 = auVar5 * auVar44 + auVar73 + auVar6 * auVar45 + auVar7 * auVar46 +
               auVar8 * ZEXT816(0x1000003d10);
      uStack_180 = auVar1._0_8_;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uStack_180 >> 0x34 | auVar1._8_8_ << 0xc;
      uStack_188 = (uStack_180 & 0xfffffffffffff) >> 0x30;
      uStack_180 = uStack_180 & 0xffffffffffff;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = sStack_d0.x.n[0];
      auVar47._8_8_ = 0;
      auVar47._0_8_ = sStack_d0.x.n[0];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = sStack_d0.x.n[1];
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar93;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = sStack_d0.x.n[2] * 2;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = sStack_d0.x.n[3];
      auVar1 = auVar10 * auVar48 + auVar74 + auVar11 * auVar49;
      uVar91 = auVar1._0_8_;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = uVar91 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = (uVar91 & 0xfffffffffffff) << 4 | uStack_188;
      auVar1 = auVar9 * auVar47 + ZEXT816(0x1000003d1) * auVar50;
      uVar91 = auVar1._0_8_;
      sStack_170.x.n[0] = uVar91 & 0xfffffffffffff;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar91 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = sStack_d0.x.n[0] * 2;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = sStack_d0.x.n[1];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = sStack_d0.x.n[2];
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar93;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = sStack_d0.x.n[3];
      auVar53._8_8_ = 0;
      auVar53._0_8_ = sStack_d0.x.n[3];
      auVar2 = auVar13 * auVar52 + auVar76 + auVar14 * auVar53;
      uVar91 = auVar2._0_8_;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar91 & 0xfffffffffffff;
      auVar1 = auVar12 * auVar51 + auVar75 + auVar15 * ZEXT816(0x1000003d10);
      uVar95 = auVar1._0_8_;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar91 >> 0x34 | auVar2._8_8_ << 0xc;
      sStack_170.x.n[1] = uVar95 & 0xfffffffffffff;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar95 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = sStack_d0.x.n[0] * 2;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = sStack_d0.x.n[2];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = sStack_d0.x.n[1];
      auVar55._8_8_ = 0;
      auVar55._0_8_ = sStack_d0.x.n[1];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = sStack_d0.x.n[3];
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar93;
      auVar78 = auVar18 * auVar56 + auVar78;
      uVar91 = auVar78._0_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar91 & 0xfffffffffffff;
      auVar1 = auVar16 * auVar54 + auVar77 + auVar17 * auVar55 + auVar19 * ZEXT816(0x1000003d10);
      uVar95 = auVar1._0_8_;
      sStack_170.x.n[2] = uVar95 & 0xfffffffffffff;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = (uVar95 >> 0x34 | auVar1._8_8_ << 0xc) + sStack_68.n[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar91 >> 0x34 | auVar78._8_8_ << 0xc;
      auVar79 = auVar20 * ZEXT816(0x1000003d10) + auVar79;
      uVar91 = auVar79._0_8_;
      sStack_170.x.n[3] = uVar91 & 0xfffffffffffff;
      sStack_170.y.n[0] = (uVar91 >> 0x34 | auVar79._8_8_ << 0xc) + uStack_180;
      sStack_170.y.n[1] = 1;
      psStack_198 = (secp256k1_scratch *)0x1084bb;
      secp256k1_fe_verify((secp256k1_fe *)&sStack_170);
      a = (secp256k1_ge *)(auStack_130 + 0x30);
      psStack_198 = (secp256k1_scratch *)0x1084cb;
      a_00 = a;
      secp256k1_fe_verify((secp256k1_fe *)a);
      if ((int)uStack_d8 < 9) {
        auVar21._8_8_ = 0;
        auVar21._0_8_ = auStack_130._48_8_ * 2;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = uStack_e8;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uStack_f8 * 2;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = uStack_f0;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = uStack_e0;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = uStack_e0;
        uVar93 = SUB168(auVar23 * auVar59,0);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar93 & 0xfffffffffffff;
        auVar1 = auVar22 * auVar58 + auVar21 * auVar57 + auVar24 * ZEXT816(0x1000003d10);
        uVar92 = auVar1._0_8_;
        uStack_180 = uVar92 & 0xfffffffffffff;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = uVar92 >> 0x34 | auVar1._8_8_ << 0xc;
        uVar92 = uStack_e0 * 2;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = auStack_130._48_8_;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = uVar92;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uStack_f8 * 2;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = uStack_e8;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uStack_f0;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = uStack_f0;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar93 >> 0x34 | SUB168(auVar23 * auVar59,8) << 0xc;
        auVar1 = auVar25 * auVar60 + auVar80 + auVar26 * auVar61 + auVar27 * auVar62 +
                 auVar28 * ZEXT816(0x1000003d10);
        uStack_188 = auVar1._0_8_;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = uStack_188 >> 0x34 | auVar1._8_8_ << 0xc;
        uStack_178 = (uStack_188 & 0xfffffffffffff) >> 0x30;
        uStack_188 = uStack_188 & 0xffffffffffff;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = auStack_130._48_8_;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = auStack_130._48_8_;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uStack_f8;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = uVar92;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uStack_f0 * 2;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = uStack_e8;
        auVar1 = auVar30 * auVar64 + auVar81 + auVar31 * auVar65;
        uVar93 = auVar1._0_8_;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = uVar93 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = (uVar93 & 0xfffffffffffff) << 4 | uStack_178;
        auVar1 = auVar29 * auVar63 + ZEXT816(0x1000003d1) * auVar66;
        uVar93 = auVar1._0_8_;
        sStack_68.n[0] = uVar93 & 0xfffffffffffff;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = uVar93 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = auStack_130._48_8_ * 2;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = uStack_f8;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uStack_f0;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = uVar92;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uStack_e8;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = uStack_e8;
        auVar2 = auVar33 * auVar68 + auVar83 + auVar34 * auVar69;
        uVar93 = auVar2._0_8_;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar93 & 0xfffffffffffff;
        auVar1 = auVar32 * auVar67 + auVar82 + auVar35 * ZEXT816(0x1000003d10);
        uVar91 = auVar1._0_8_;
        auVar85._8_8_ = 0;
        auVar85._0_8_ = uVar93 >> 0x34 | auVar2._8_8_ << 0xc;
        sStack_68.n[1] = uVar91 & 0xfffffffffffff;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = uVar91 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = auStack_130._48_8_ * 2;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = uStack_f0;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uStack_f8;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = uStack_f8;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uStack_e8;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = uVar92;
        auVar85 = auVar38 * auVar72 + auVar85;
        uVar92 = auVar85._0_8_;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar92 & 0xfffffffffffff;
        auVar1 = auVar36 * auVar70 + auVar84 + auVar37 * auVar71 + auVar39 * ZEXT816(0x1000003d10);
        uVar93 = auVar1._0_8_;
        sStack_68.n[2] = uVar93 & 0xfffffffffffff;
        auVar86._8_8_ = 0;
        auVar86._0_8_ = (uVar93 >> 0x34 | auVar1._8_8_ << 0xc) + uStack_180;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar92 >> 0x34 | auVar85._8_8_ << 0xc;
        auVar86 = auVar40 * ZEXT816(0x1000003d10) + auVar86;
        uVar92 = auVar86._0_8_;
        sStack_68.n[3] = uVar92 & 0xfffffffffffff;
        sStack_68.n[4] = (uVar92 >> 0x34 | auVar86._8_8_ << 0xc) + uStack_188;
        sStack_68.magnitude = 1;
        sStack_68.normalized = 0;
        psStack_198 = (secp256k1_scratch *)0x108715;
        secp256k1_fe_verify(&sStack_68);
        psStack_198 = (secp256k1_scratch *)0x108728;
        secp256k1_fe_mul(&sStack_68,&sStack_68,(secp256k1_fe *)(auStack_130 + 0x30));
        psStack_198 = (secp256k1_scratch *)0x108730;
        secp256k1_fe_verify(&sStack_68);
        sStack_68.n[0] = sStack_68.n[0] + 2;
        sStack_68.normalized = 0;
        sStack_68.magnitude = sStack_68.magnitude + 1;
        psStack_198 = (secp256k1_scratch *)0x108746;
        secp256k1_fe_verify(&sStack_68);
        psStack_198 = (secp256k1_scratch *)0x108753;
        iVar89 = secp256k1_fe_equal_var((secp256k1_fe *)&sStack_170,&sStack_68);
        goto LAB_00108756;
      }
      goto LAB_00108835;
    }
  }
  uVar93 = 0;
  psStack_198 = (secp256k1_scratch *)0x108835;
  secp256k1_ec_pubkey_parse_cold_2();
LAB_00108835:
  psStack_198 = (secp256k1_scratch *)secp256k1_ge_is_in_correct_subgroup;
  secp256k1_ec_pubkey_parse_cold_1();
  psStack_1b0 = a;
  uStack_1a8 = uVar93;
  uStack_1a0 = uVar92;
  psStack_198 = scratch;
  secp256k1_ge_verify(a_00);
  secp256k1_gej_set_infinity(&sStack_248);
  uVar94 = 0x1f;
  do {
    secp256k1_gej_double_var(&sStack_248,&sStack_248,(secp256k1_fe *)0x0);
    if ((0xdU >> (uVar94 & 0x1f) & 1) != 0) {
      secp256k1_gej_add_ge_var(&sStack_248,&sStack_248,a_00,(secp256k1_fe *)0x0);
    }
    bVar97 = uVar94 != 0;
    uVar94 = uVar94 - 1;
  } while (bVar97);
  secp256k1_gej_verify(&sStack_248);
  return;
}

Assistant:

static void secp256k1_scratch_destroy(const secp256k1_callback* error_callback, secp256k1_scratch* scratch) {
    if (scratch != NULL) {
        if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
            secp256k1_callback_call(error_callback, "invalid scratch space");
            return;
        }
        VERIFY_CHECK(scratch->alloc_size == 0); /* all checkpoints should be applied */
        memset(scratch->magic, 0, sizeof(scratch->magic));
        free(scratch);
    }
}